

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O0

void __thiscall QTimer::QTimer(QTimer *this,QObject *parent)

{
  QTimer *in_RSI;
  QTimerPrivate *in_RDI;
  QObject *in_stack_00000020;
  QTimerPrivate *this_00;
  
  (in_RDI->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR_metaObject_00be7ac0;
  this_00 = in_RDI;
  operator_new(0xa8);
  QTimerPrivate::QTimerPrivate(this_00,in_RSI);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)parent,in_stack_00000020);
  (in_RDI->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR_metaObject_00be7ac0;
  return;
}

Assistant:

QTimer::QTimer(QObject *parent)
    : QObject(*new QTimerPrivate(this), parent)
{
    Q_ASSERT(d_func()->isQTimer);
}